

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O3

int ecdsa_sign_proxy(int type,uchar *m,int m_len,uchar *_sigret,uint *_siglen,BIGNUM *kinv,
                    BIGNUM *rp,EC_KEY *ec_key)

{
  char **__src;
  size_t sVar1;
  char *pcVar2;
  int iVar3;
  int *piVar4;
  char *pcVar5;
  st_neverbleed_thread_data_t *thdata;
  st_neverbleed_thread_data_t *local_68;
  st_neverbleed_rsa_exdata_t *local_60;
  expbuf_t local_58;
  
  local_58.end = (char *)0x0;
  local_58.capacity = 0;
  local_58.buf = (char *)0x0;
  local_58.start = (char *)0x0;
  ecdsa_get_privsep_data(ec_key,&local_60,&local_68);
  if (kinv == (BIGNUM *)0x0 && rp == (BIGNUM *)0x0) {
    expbuf_reserve(&local_58,0xb);
    builtin_strncpy(local_58.end,"ecdsa_si",8);
    *(undefined4 *)((long)local_58.end + 7) = 0x6e6769;
    local_58.end = (char *)((long)local_58.end + 0xb);
    expbuf_reserve(&local_58,8);
    *(long *)local_58.end = (long)type;
    local_58.end = (char *)((long)local_58.end + 8);
    expbuf_push_bytes(&local_58,m,(long)m_len);
    sVar1 = local_60->key_index;
    expbuf_reserve(&local_58,8);
    *(size_t *)local_58.end = sVar1;
    local_58.end = (char *)((long)local_58.end + 8);
    iVar3 = expbuf_write((expbuf_t *)local_58.start,(int)local_58.end);
    if (iVar3 == 0) {
      expbuf_dispose(&local_58);
      iVar3 = expbuf_read(&local_58,local_68->fd);
      if (iVar3 == 0) {
        if ((7 < (ulong)((long)local_58.end - (long)local_58.start)) &&
           (7 < ((long)local_58.end - (long)local_58.start) - 8U)) {
          pcVar5 = *(char **)((long)local_58.start + 8);
          __src = (char **)((long)local_58.start + 0x10);
          if (pcVar5 <= (char *)((long)local_58.end - (long)__src)) {
            pcVar2 = *(char **)local_58.start;
            local_58.start = (char *)((long)__src + (long)pcVar5);
            memcpy(_sigret,__src,(size_t)pcVar5);
            *_siglen = (uint)pcVar5;
            expbuf_dispose(&local_58);
            return (int)pcVar2;
          }
        }
        piVar4 = __errno_location();
        *piVar4 = 0;
        pcVar5 = "failed to parse response";
        goto LAB_00189425;
      }
      piVar4 = __errno_location();
      iVar3 = *piVar4;
      pcVar5 = "read error";
    }
    else {
      piVar4 = __errno_location();
      iVar3 = *piVar4;
      pcVar5 = "write error";
    }
    if (iVar3 == 0) {
      pcVar5 = "connection closed by daemon";
    }
  }
  else {
    piVar4 = __errno_location();
    *piVar4 = 0;
    pcVar5 = "unexpected non-NULL kinv and rp";
  }
LAB_00189425:
  dief(pcVar5);
}

Assistant:

static int ecdsa_sign_proxy(int type, const unsigned char *m, int m_len, unsigned char *_sigret, unsigned int *_siglen,
                            const BIGNUM *kinv, const BIGNUM *rp, EC_KEY *ec_key)
{
    struct st_neverbleed_rsa_exdata_t *exdata;
    struct st_neverbleed_thread_data_t *thdata;
    struct expbuf_t buf = {};
    size_t ret, siglen;
    unsigned char *sigret;

    ecdsa_get_privsep_data(ec_key, &exdata, &thdata);

    /* as far as I've tested so far, kinv and rp are always NULL.
       Looks like setup_sign will precompute this, but it is only
       called sign_sig, and it seems to be not used in TLS ECDSA */
    if (kinv != NULL || rp != NULL) {
        errno = 0;
        dief("unexpected non-NULL kinv and rp");
    }

    expbuf_push_str(&buf, "ecdsa_sign");
    expbuf_push_num(&buf, type);
    expbuf_push_bytes(&buf, m, m_len);
    expbuf_push_num(&buf, exdata->key_index);
    if (expbuf_write(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "write error" : "connection closed by daemon");
    expbuf_dispose(&buf);

    if (expbuf_read(&buf, thdata->fd) != 0)
        dief(errno != 0 ? "read error" : "connection closed by daemon");
    if (expbuf_shift_num(&buf, &ret) != 0 || (sigret = expbuf_shift_bytes(&buf, &siglen)) == NULL) {
        errno = 0;
        dief("failed to parse response");
    }
    memcpy(_sigret, sigret, siglen);
    *_siglen = (unsigned)siglen;
    expbuf_dispose(&buf);

    return (int)ret;
}